

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void FFSClearTimestepData(SstStream Stream)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  iVar2 = Stream->WriterCohortSize;
  if (0 < iVar2) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      if (*(void **)(*(long *)(piVar1 + 0x10) + lVar4) != (void *)0x0) {
        free(*(void **)(*(long *)(piVar1 + 0x10) + lVar4));
      }
      lVar3 = lVar3 + 1;
      iVar2 = Stream->WriterCohortSize;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < iVar2);
  }
  memset(*(void **)(piVar1 + 0x10),0,(long)iVar2 * 0x18);
  memset(*(void **)(piVar1 + 8),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(piVar1 + 10),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(piVar1 + 0xc),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(piVar1 + 0xe),0,(long)Stream->WriterCohortSize << 3);
  iVar2 = *piVar1;
  if (0 < (long)iVar2) {
    lVar3 = *(long *)(piVar1 + 2);
    lVar4 = 0;
    do {
      **(undefined8 **)(lVar3 + lVar4 * 8) = 0;
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  return;
}

Assistant:

extern void FFSClearTimestepData(SstStream Stream)
{

    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int i;
    for (i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Info->WriterInfo[i].RawBuffer)
            free(Info->WriterInfo[i].RawBuffer);
    }
    memset(Info->WriterInfo, 0, sizeof(Info->WriterInfo[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataBaseAddrs, 0,
           sizeof(Info->MetadataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataFieldLists, 0,
           sizeof(Info->MetadataFieldLists[0]) * Stream->WriterCohortSize);
    memset(Info->DataBaseAddrs, 0, sizeof(Info->DataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->DataFieldLists, 0, sizeof(Info->DataFieldLists[0]) * Stream->WriterCohortSize);
    for (i = 0; i < Info->VarCount; i++)
    {
        Info->VarList[i]->Variable = NULL;
    }
}